

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptLibrary.cpp
# Opt level: O1

HeapArgumentsObject * __thiscall
Js::JavascriptLibrary::CreateHeapArguments
          (JavascriptLibrary *this,Var frameObj,uint32 formalCount,bool isStrictMode)

{
  ushort uVar1;
  Recycler *this_00;
  DynamicType *type;
  code *pcVar2;
  bool bVar3;
  BOOL BVar4;
  undefined4 *puVar5;
  Recycler *this_01;
  HeapArgumentsObject *this_02;
  ActivationObject *obj;
  undefined1 local_70 [8];
  TrackAllocData data;
  
  if ((this->heapArgumentsType).ptr == (DynamicType *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar5 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptLibrary.cpp"
                                ,0x1713,"(heapArgumentsType)","Where\'s heapArgumentsType?");
    if (!bVar3) goto LAB_00bfcd19;
    *puVar5 = 0;
  }
  if ((this->strictHeapArgumentsType).ptr == (DynamicType *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar5 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptLibrary.cpp"
                                ,0x1714,"(strictHeapArgumentsType)","strictHeapArgumentsType");
    if (!bVar3) goto LAB_00bfcd19;
    *puVar5 = 0;
  }
  this_00 = this->recycler;
  data._32_8_ = frameObj;
  EnsureArrayPrototypeValuesFunction(this);
  type = (&this->heapArgumentsType)[isStrictMode].ptr;
  data.typeinfo = (type_info *)((ulong)((type->typeHandler).ptr)->inlineSlotCapacity << 3);
  local_70 = (undefined1  [8])&HeapArgumentsObject::typeinfo;
  data.plusSize = 0xffffffffffffffff;
  data.count = (size_t)anon_var_dwarf_766a001;
  data.filename._0_4_ = 0x171e;
  this_01 = Memory::Recycler::TrackAllocInfo(this_00,(TrackAllocData *)local_70);
  uVar1 = ((type->typeHandler).ptr)->inlineSlotCapacity;
  BVar4 = ExceptionCheck::CanHandleOutOfMemory();
  if (BVar4 == 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar5 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                                ,0x207,"(ExceptionCheck::CanHandleOutOfMemory())",
                                "ExceptionCheck::CanHandleOutOfMemory()");
    if (!bVar3) goto LAB_00bfcd19;
    *puVar5 = 0;
  }
  this_02 = (HeapArgumentsObject *)
            Memory::Recycler::AllocZeroWithAttributes<(Memory::ObjectInfoBits)256,false>
                      (this_01,(ulong)uVar1 * 8 + 0x38);
  if (this_02 == (HeapArgumentsObject *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar5 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                                ,0x20d,"(buffer != nullptr)","buffer != nullptr");
    if (!bVar3) {
LAB_00bfcd19:
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar5 = 0;
  }
  obj = (ActivationObject *)0x0;
  if ((this->super_JavascriptLibraryBase).nullValue.ptr != (RecyclableObject *)data._32_8_) {
    obj = (ActivationObject *)data._32_8_;
  }
  HeapArgumentsObject::HeapArgumentsObject(this_02,this_00,obj,formalCount,type);
  return this_02;
}

Assistant:

HeapArgumentsObject* JavascriptLibrary::CreateHeapArguments(Var frameObj, uint32 formalCount, bool isStrictMode)
    {
        AssertMsg(heapArgumentsType, "Where's heapArgumentsType?");
        Assert(strictHeapArgumentsType);

        Recycler *recycler = this->GetRecycler();

        EnsureArrayPrototypeValuesFunction(); //InitializeArrayPrototype can be delay loaded, which could prevent us from access to array.prototype.values

        DynamicType * argumentsType = isStrictMode ? strictHeapArgumentsType : heapArgumentsType;

        return RecyclerNewPlusZ(recycler, argumentsType->GetTypeHandler()->GetInlineSlotCapacity() * sizeof(Var), HeapArgumentsObject, recycler,
            frameObj != GetNull() ? static_cast<ActivationObject*>(frameObj) : nullptr,
            formalCount, argumentsType);
    }